

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenAtomicStore(BinaryenModuleRef module,uint32_t bytes,uint32_t offset,
                   BinaryenExpressionRef ptr,BinaryenExpressionRef value,BinaryenType type,
                   char *memoryName)

{
  Store *pSVar1;
  Address offset_00;
  Name memory;
  Builder local_38;
  
  offset_00.addr._4_4_ = 0;
  offset_00.addr._0_4_ = offset;
  local_38.wasm = module;
  memory = getMemoryName(module,memoryName);
  pSVar1 = wasm::Builder::makeStore(&local_38,bytes,offset_00,bytes,ptr,value,(Type)type,memory);
  pSVar1->isAtomic = true;
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicStore(BinaryenModuleRef module,
                                          uint32_t bytes,
                                          uint32_t offset,
                                          BinaryenExpressionRef ptr,
                                          BinaryenExpressionRef value,
                                          BinaryenType type,
                                          const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicStore(bytes,
                       offset,
                       (Expression*)ptr,
                       (Expression*)value,
                       Type(type),
                       getMemoryName(module, memoryName)));
}